

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestaccessmanager_p.h
# Opt level: O1

QNetworkReply * __thiscall
QRestAccessManagerPrivate::executeRequest
          (QRestAccessManagerPrivate *this,ReqOpRefJson requestOperation,QJsonDocument *jsonDoc,
          QNetworkRequest *request,QObject *context,QSlotObjectBase *rawSlot)

{
  QNetworkAccessManager *pQVar1;
  bool bVar2;
  QNetworkReply *reply;
  long in_FS_OFFSET;
  QAnyStringView value;
  QHttpHeaders h;
  QNetworkRequest req;
  QSlotObjectBase *local_70;
  QByteArray local_68;
  QNetworkRequest local_50;
  QNetworkRequest local_48;
  QNetworkAccessManager *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->qnam == (QNetworkAccessManager *)0x0) {
    warnNoAccessManager(this);
    reply = (QNetworkReply *)0x0;
  }
  else {
    verifyThreadAffinity(this,context);
    local_48.d.d.ptr = (QSharedDataPointer<QNetworkRequestPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QNetworkRequest::QNetworkRequest(&local_48,request);
    local_50.d.d.ptr = (QSharedDataPointer<QNetworkRequestPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QNetworkRequest::headers(&local_50);
    bVar2 = QHttpHeaders::contains((QHttpHeaders *)&local_50,ContentType);
    if (!bVar2) {
      value.m_size = 0x4000000000000010;
      value.field_0.m_data_utf8 = "application/json";
      QHttpHeaders::append((QHttpHeaders *)&local_50,ContentType,value);
    }
    QNetworkRequest::setHeaders(&local_48,(QHttpHeaders *)&local_50);
    pQVar1 = this->qnam;
    QJsonDocument::toJson((JsonFormat)&local_68);
    local_40 = pQVar1;
    reply = (*requestOperation.
              super_function_ref_base<false,_const_void,_QNetworkReply_*,_QNetworkAccessManager_*,_const_QNetworkRequest_&,_const_QByteArray_&>
              .m_thunk_ptr)((BoundEntityType)
                            requestOperation.
                            super_function_ref_base<false,_const_void,_QNetworkReply_*,_QNetworkAccessManager_*,_const_QNetworkRequest_&,_const_QByteArray_&>
                            .m_bound_entity.obj,&local_40,&local_48,&local_68);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
      }
    }
    local_70 = rawSlot;
    createActiveRequest(this,reply,context,(SlotObjUniquePtr)&local_70);
    if (local_70 != (QSlotObjectBase *)0x0) {
      LOCK();
      (local_70->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (local_70->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_70->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i == 0) {
        (*local_70->m_impl)(0,local_70,(QObject *)0x0,(void **)0x0,(bool *)0x0);
      }
    }
    local_70 = (QSlotObjectBase *)0x0;
    QHttpHeaders::~QHttpHeaders((QHttpHeaders *)&local_50);
    QNetworkRequest::~QNetworkRequest(&local_48);
    rawSlot = (QSlotObjectBase *)0x0;
  }
  if (rawSlot != (QSlotObjectBase *)0x0) {
    LOCK();
    (rawSlot->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (rawSlot->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((rawSlot->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      (*rawSlot->m_impl)(0,rawSlot,(QObject *)0x0,(void **)0x0,(bool *)0x0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return reply;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReply *executeRequest(ReqOpRefJson requestOperation, const QJsonDocument &jsonDoc,
                               const QNetworkRequest &request,
                               const QObject *context, QtPrivate::QSlotObjectBase *rawSlot)
    {
        QtPrivate::SlotObjUniquePtr slot(rawSlot);
        if (!qnam)
            return warnNoAccessManager();
        verifyThreadAffinity(context);
        QNetworkRequest req(request);
        auto h = req.headers();
        if (!h.contains(QHttpHeaders::WellKnownHeader::ContentType)) {
            h.append(QHttpHeaders::WellKnownHeader::ContentType,
                     QLatin1StringView{"application/json"});
        }
        req.setHeaders(std::move(h));
        QNetworkReply *reply = requestOperation(qnam, req, jsonDoc.toJson(QJsonDocument::Compact));
        return createActiveRequest(reply, context, std::move(slot));
    }